

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

void term_size(Terminal *term,wchar_t newrows,wchar_t newcols,wchar_t newsavelines)

{
  wchar_t wVar1;
  wchar_t which;
  termchar *ptVar2;
  Backend *pBVar3;
  size_t n;
  wchar_t wVar4;
  wchar_t index;
  wchar_t wVar5;
  int index_00;
  wchar_t wVar6;
  tree234 *ptVar7;
  compressed_scrollback_line *pcVar8;
  termline *ptVar9;
  void *ptr;
  termline **pptVar10;
  uchar *puVar11;
  ulong uVar12;
  long lVar13;
  wchar_t wVar14;
  termline **ptr_00;
  tree234 *t;
  ulong uVar15;
  
  wVar1 = term->rows;
  uVar12 = (ulong)(uint)wVar1;
  which = term->alt_which;
  if (((wVar1 == newrows) && (term->cols == newcols)) && (term->savelines == newsavelines)) {
    return;
  }
  n = 1;
  if (newrows < L'\x02') {
    newrows = L'\x01';
  }
  if (L'\x01' < newcols) {
    n = (size_t)(uint)newcols;
  }
  term->selstate = LEXICOGRAPHIC;
  (term->selstart).y = L'\0';
  (term->selstart).x = L'\0';
  (term->selend).y = L'\0';
  (term->selend).x = L'\0';
  swap_screen(term,L'\0',false,false);
  term->marg_t = L'\0';
  term->alt_t = L'\0';
  wVar4 = newrows + L'\xffffffff';
  term->marg_b = wVar4;
  term->alt_b = wVar4;
  if (term->rows == L'\xffffffff') {
    ptVar7 = newtree234((cmpfn234_conflict)0x0);
    term->scrollback = ptVar7;
    ptVar7 = newtree234((cmpfn234_conflict)0x0);
    term->screen = ptVar7;
    term->tempsblines = L'\0';
    term->rows = L'\0';
  }
  index = count234(term->scrollback);
  wVar14 = term->rows;
  wVar5 = count234(term->screen);
  if (wVar14 != wVar5) {
    __assert_fail("term->rows == count234(term->screen)",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                  ,0x88d,"void term_size(Terminal *, int, int, int)");
  }
  wVar14 = term->rows;
  while (wVar5 = (wchar_t)n, wVar14 < newrows) {
    if (term->tempsblines < L'\x01') {
      ptVar9 = newtermline(term,wVar5,false);
      ptVar7 = term->screen;
      index_00 = count234(ptVar7);
      addpos234(ptVar7,ptVar9,index_00);
    }
    else {
      if (index < term->tempsblines) {
        __assert_fail("sblen >= term->tempsblines",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                      ,0x892,"void term_size(Terminal *, int, int, int)");
      }
      index = index + L'\xffffffff';
      pcVar8 = (compressed_scrollback_line *)delpos234(term->scrollback,index);
      ptVar9 = decompressline(pcVar8);
      safefree(pcVar8);
      ptVar9->temporary = false;
      term->tempsblines = term->tempsblines + L'\xffffffff';
      addpos234(term->screen,ptVar9,0);
      (term->curs).y = (term->curs).y + L'\x01';
      (term->savecurs).y = (term->savecurs).y + L'\x01';
      term->alt_y = term->alt_y + L'\x01';
      (term->alt_savecurs).y = (term->alt_savecurs).y + L'\x01';
    }
    wVar14 = term->rows + L'\x01';
    term->rows = wVar14;
  }
  while (newrows < wVar14) {
    if ((term->curs).y < wVar14 + L'\xffffffff') {
      ptVar9 = (termline *)delpos234(term->screen,wVar14 + L'\xffffffff');
      freetermline(ptVar9);
    }
    else {
      ptVar9 = (termline *)delpos234(term->screen,0);
      ptVar7 = term->scrollback;
      pcVar8 = compressline(ptVar9);
      addpos234(ptVar7,pcVar8,index);
      freetermline(ptVar9);
      term->tempsblines = term->tempsblines + L'\x01';
      (term->curs).y = (term->curs).y + L'\xffffffff';
      (term->savecurs).y = (term->savecurs).y + L'\xffffffff';
      term->alt_y = term->alt_y + L'\xffffffff';
      (term->alt_savecurs).y = (term->alt_savecurs).y + L'\xffffffff';
      index = index + L'\x01';
    }
    wVar14 = term->rows + L'\xffffffff';
    term->rows = wVar14;
  }
  if (wVar14 != newrows) {
    __assert_fail("term->rows == newrows",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                  ,0x8b7,"void term_size(Terminal *, int, int, int)");
  }
  wVar6 = count234(term->screen);
  wVar14 = index;
  if (wVar6 != newrows) {
    __assert_fail("count234(term->screen) == newrows",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                  ,0x8b8,"void term_size(Terminal *, int, int, int)");
  }
  for (; newsavelines < wVar14; wVar14 = wVar14 + L'\xffffffff') {
    ptr = delpos234(term->scrollback,0);
    safefree(ptr);
  }
  if (newsavelines <= index) {
    index = newsavelines;
  }
  if (index < term->tempsblines) {
    term->tempsblines = index;
  }
  wVar14 = count234(term->scrollback);
  if (newsavelines < wVar14) {
    __assert_fail("count234(term->scrollback) <= newsavelines",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                  ,0x8c2,"void term_size(Terminal *, int, int, int)");
  }
  wVar14 = count234(term->scrollback);
  if (wVar14 < term->tempsblines) {
    __assert_fail("count234(term->scrollback) >= term->tempsblines",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                  ,0x8c3,"void term_size(Terminal *, int, int, int)");
  }
  term->disptop = L'\0';
  pptVar10 = (termline **)safemalloc((ulong)(uint)newrows,8,0);
  for (uVar15 = 0; uVar15 != (uint)newrows; uVar15 = uVar15 + 1) {
    ptVar9 = newtermline(term,wVar5,false);
    pptVar10[uVar15] = ptVar9;
    ptVar2 = ptVar9->chars;
    for (lVar13 = 0; n << 5 != lVar13; lVar13 = lVar13 + 0x20) {
      *(undefined8 *)((long)&ptVar2->attr + lVar13) = 0x3ffff;
    }
  }
  wVar14 = L'\0';
  if (term->disptext == (termline **)0x0) {
    ptr_00 = (termline **)0x0;
  }
  else {
    if (wVar1 < L'\x01') {
      uVar12 = 0;
    }
    for (uVar15 = 0; ptr_00 = term->disptext, uVar12 != uVar15; uVar15 = uVar15 + 1) {
      freetermline(ptr_00[uVar15]);
    }
  }
  safefree(ptr_00);
  term->disptext = pptVar10;
  term->dispcursx = L'\xffffffff';
  term->dispcursy = L'\xffffffff';
  ptVar7 = newtree234((cmpfn234_conflict)0x0);
  for (; newrows != wVar14; wVar14 = wVar14 + L'\x01') {
    ptVar9 = newtermline(term,wVar5,true);
    addpos234(ptVar7,ptVar9,wVar14);
  }
  t = term->alt_screen;
  if (t != (tree234 *)0x0) {
    while (ptVar9 = (termline *)delpos234(t,0), ptVar9 != (termline *)0x0) {
      freetermline(ptVar9);
      t = term->alt_screen;
    }
    freetree234(term->alt_screen);
  }
  term->alt_screen = ptVar7;
  term->alt_sblines = L'\0';
  puVar11 = (uchar *)saferealloc(term->tabs,n,1);
  term->tabs = puVar11;
  uVar12 = 0;
  if (L'\0' < term->cols) {
    uVar12 = (ulong)(uint)term->cols;
  }
  for (; uVar12 < n; uVar12 = uVar12 + 1) {
    term->tabs[uVar12] = (uVar12 & 7) == 0;
  }
  wVar1 = (term->savecurs).y;
  if (wVar1 < L'\0') {
    wVar14 = L'\0';
LAB_0010971f:
    (term->savecurs).y = wVar14;
  }
  else {
    wVar14 = wVar4;
    if ((uint)newrows <= (uint)wVar1) goto LAB_0010971f;
  }
  if (wVar5 <= (term->savecurs).x) {
    (term->savecurs).x = wVar5 + L'\xffffffff';
  }
  wVar1 = (term->alt_savecurs).y;
  if (wVar1 < L'\0') {
    wVar14 = L'\0';
LAB_0010974d:
    (term->alt_savecurs).y = wVar14;
  }
  else {
    wVar14 = wVar4;
    if ((uint)newrows <= (uint)wVar1) goto LAB_0010974d;
  }
  if (wVar5 <= (term->alt_savecurs).x) {
    (term->alt_savecurs).x = wVar5 + L'\xffffffff';
  }
  wVar1 = (term->curs).y;
  if (wVar1 < L'\0') {
    wVar4 = L'\0';
  }
  else if ((uint)wVar1 < (uint)newrows) goto LAB_0010977f;
  (term->curs).y = wVar4;
LAB_0010977f:
  if (wVar5 <= (term->curs).x) {
    (term->curs).x = wVar5 + L'\xffffffff';
  }
  term->wrapnext = false;
  term->alt_x = L'\0';
  term->alt_y = L'\0';
  term->alt_wnext = false;
  term->rows = newrows;
  term->cols = wVar5;
  term->savelines = newsavelines;
  swap_screen(term,which,false,false);
  term->win_scrollbar_update_pending = true;
  term_schedule_update(term);
  pBVar3 = term->backend;
  if (pBVar3 == (Backend *)0x0) {
    return;
  }
  (*pBVar3->vt->size)(pBVar3,term->cols,term->rows);
  return;
}

Assistant:

void term_size(Terminal *term, int newrows, int newcols, int newsavelines)
{
    tree234 *newalt;
    termline **newdisp, *line;
    int i, j, oldrows = term->rows;
    int sblen;
    int save_alt_which = term->alt_which;

    if (newrows == term->rows && newcols == term->cols &&
        newsavelines == term->savelines)
        return;                        /* nothing to do */

    /* Behave sensibly if we're given zero (or negative) rows/cols */

    if (newrows < 1) newrows = 1;
    if (newcols < 1) newcols = 1;

    deselect(term);
    swap_screen(term, 0, false, false);

    term->alt_t = term->marg_t = 0;
    term->alt_b = term->marg_b = newrows - 1;

    if (term->rows == -1) {
        term->scrollback = newtree234(NULL);
        term->screen = newtree234(NULL);
        term->tempsblines = 0;
        term->rows = 0;
    }

    /*
     * Resize the screen and scrollback. We only need to shift
     * lines around within our data structures, because lineptr()
     * will take care of resizing each individual line if
     * necessary. So:
     *
     *  - If the new screen is longer, we shunt lines in from temporary
     *    scrollback if possible, otherwise we add new blank lines at
     *    the bottom.
     *
     *  - If the new screen is shorter, we remove any blank lines at
     *    the bottom if possible, otherwise shunt lines above the cursor
     *    to scrollback if possible, otherwise delete lines below the
     *    cursor.
     *
     *  - Then, if the new scrollback length is less than the
     *    amount of scrollback we actually have, we must throw some
     *    away.
     */
    sblen = count234(term->scrollback);
    /* Do this loop to expand the screen if newrows > rows */
    assert(term->rows == count234(term->screen));
    while (term->rows < newrows) {
        if (term->tempsblines > 0) {
            compressed_scrollback_line *cline;
            /* Insert a line from the scrollback at the top of the screen. */
            assert(sblen >= term->tempsblines);
            cline = delpos234(term->scrollback, --sblen);
            line = decompressline(cline);
            sfree(cline);
            line->temporary = false;   /* reconstituted line is now real */
            term->tempsblines -= 1;
            addpos234(term->screen, line, 0);
            term->curs.y += 1;
            term->savecurs.y += 1;
            term->alt_y += 1;
            term->alt_savecurs.y += 1;
        } else {
            /* Add a new blank line at the bottom of the screen. */
            line = newtermline(term, newcols, false);
            addpos234(term->screen, line, count234(term->screen));
        }
        term->rows += 1;
    }
    /* Do this loop to shrink the screen if newrows < rows */
    while (term->rows > newrows) {
        if (term->curs.y < term->rows - 1) {
            /* delete bottom row, unless it contains the cursor */
            line = delpos234(term->screen, term->rows - 1);
            freetermline(line);
        } else {
            /* push top row to scrollback */
            line = delpos234(term->screen, 0);
            addpos234(term->scrollback, compressline(line), sblen++);
            freetermline(line);
            term->tempsblines += 1;
            term->curs.y -= 1;
            term->savecurs.y -= 1;
            term->alt_y -= 1;
            term->alt_savecurs.y -= 1;
        }
        term->rows -= 1;
    }
    assert(term->rows == newrows);
    assert(count234(term->screen) == newrows);

    /* Delete any excess lines from the scrollback. */
    while (sblen > newsavelines) {
        line = delpos234(term->scrollback, 0);
        sfree(line);
        sblen--;
    }
    if (sblen < term->tempsblines)
        term->tempsblines = sblen;
    assert(count234(term->scrollback) <= newsavelines);
    assert(count234(term->scrollback) >= term->tempsblines);
    term->disptop = 0;

    /* Make a new displayed text buffer. */
    newdisp = snewn(newrows, termline *);
    for (i = 0; i < newrows; i++) {
        newdisp[i] = newtermline(term, newcols, false);
        for (j = 0; j < newcols; j++)
            newdisp[i]->chars[j].attr = ATTR_INVALID;
    }
    if (term->disptext) {
        for (i = 0; i < oldrows; i++)
            freetermline(term->disptext[i]);
    }
    sfree(term->disptext);
    term->disptext = newdisp;
    term->dispcursx = term->dispcursy = -1;

    /* Make a new alternate screen. */
    newalt = newtree234(NULL);
    for (i = 0; i < newrows; i++) {
        line = newtermline(term, newcols, true);
        addpos234(newalt, line, i);
    }
    if (term->alt_screen) {
        while (NULL != (line = delpos234(term->alt_screen, 0)))
            freetermline(line);
        freetree234(term->alt_screen);
    }
    term->alt_screen = newalt;
    term->alt_sblines = 0;

    term->tabs = sresize(term->tabs, newcols, unsigned char);
    {
        int i;
        for (i = (term->cols > 0 ? term->cols : 0); i < newcols; i++)
            term->tabs[i] = (i % 8 == 0 ? true : false);
    }

    /* Check that the cursor positions are still valid. */
    if (term->savecurs.y < 0)
        term->savecurs.y = 0;
    if (term->savecurs.y >= newrows)
        term->savecurs.y = newrows - 1;
    if (term->savecurs.x >= newcols)
        term->savecurs.x = newcols - 1;
    if (term->alt_savecurs.y < 0)
        term->alt_savecurs.y = 0;
    if (term->alt_savecurs.y >= newrows)
        term->alt_savecurs.y = newrows - 1;
    if (term->alt_savecurs.x >= newcols)
        term->alt_savecurs.x = newcols - 1;
    if (term->curs.y < 0)
        term->curs.y = 0;
    if (term->curs.y >= newrows)
        term->curs.y = newrows - 1;
    if (term->curs.x >= newcols)
        term->curs.x = newcols - 1;
    if (term->alt_y < 0)
        term->alt_y = 0;
    if (term->alt_y >= newrows)
        term->alt_y = newrows - 1;
    if (term->alt_x >= newcols)
        term->alt_x = newcols - 1;
    term->alt_x = term->alt_y = 0;
    term->wrapnext = false;
    term->alt_wnext = false;

    term->rows = newrows;
    term->cols = newcols;
    term->savelines = newsavelines;

    swap_screen(term, save_alt_which, false, false);

    term->win_scrollbar_update_pending = true;
    term_schedule_update(term);
    if (term->backend)
        backend_size(term->backend, term->cols, term->rows);
}